

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

void __thiscall tinyxml2::MemPoolT<104>::Free(MemPoolT<104> *this,void *mem)

{
  if (mem != (void *)0x0) {
    this->_currentAllocs = this->_currentAllocs + -1;
    *(Item **)mem = this->_root;
    this->_root = (Item *)mem;
  }
  return;
}

Assistant:

virtual void Free(void* mem)
    {
        if (!mem) {
            return;
        }
        --_currentAllocs;
        Item* item = static_cast<Item*>(mem);
#ifdef TINYXML2_DEBUG
        memset(item, 0xfe, sizeof(*item));
#endif
        item->next = _root;
        _root = item;
    }